

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_decode_atom.c
# Opt level: O0

int base64_decode_atom(char *atom,uchar *out)

{
  char cVar1;
  int iVar2;
  uint uStack_44;
  char c;
  uint word;
  int len;
  int v;
  int i;
  int vals [4];
  uchar *out_local;
  char *atom_local;
  
  len = 0;
  do {
    if (3 < len) {
      if ((v == -1) || (i == -1)) {
        atom_local._4_4_ = 0;
      }
      else if ((vals[0] == -1) && (vals[1] != -1)) {
        atom_local._4_4_ = 0;
      }
      else {
        if (vals[1] == -1) {
          if (vals[0] == -1) {
            uStack_44 = 1;
          }
          else {
            uStack_44 = 2;
          }
        }
        else {
          uStack_44 = 3;
        }
        iVar2 = (vals[0] & 0x3fU) << 6;
        *out = (byte)((uint)(v << 0x12) >> 0x10) | (byte)((uint)(i << 0xc) >> 0x10);
        if (1 < uStack_44) {
          out[1] = (byte)((uint)(i << 0xc) >> 8) | (byte)((uint)iVar2 >> 8);
        }
        if (2 < uStack_44) {
          out[2] = (byte)iVar2 | (byte)vals[1] & 0x3f;
        }
        atom_local._4_4_ = uStack_44;
      }
      return atom_local._4_4_;
    }
    cVar1 = atom[len];
    if ((cVar1 < 'A') || ('Z' < cVar1)) {
      if ((cVar1 < 'a') || ('z' < cVar1)) {
        if ((cVar1 < '0') || ('9' < cVar1)) {
          if (cVar1 == '+') {
            word = 0x3e;
          }
          else if (cVar1 == '/') {
            word = 0x3f;
          }
          else {
            if (cVar1 != '=') {
              return 0;
            }
            word = 0xffffffff;
          }
        }
        else {
          word = (int)cVar1 + 4;
        }
      }
      else {
        word = (int)cVar1 - 0x47;
      }
    }
    else {
      word = (int)cVar1 - 0x41;
    }
    (&v)[len] = word;
    len = len + 1;
  } while( true );
}

Assistant:

int base64_decode_atom(const char *atom, unsigned char *out)
{
    int vals[4];
    int i, v, len;
    unsigned word;
    char c;

    for (i = 0; i < 4; i++) {
        c = atom[i];
        if (c >= 'A' && c <= 'Z')
            v = c - 'A';
        else if (c >= 'a' && c <= 'z')
            v = c - 'a' + 26;
        else if (c >= '0' && c <= '9')
            v = c - '0' + 52;
        else if (c == '+')
            v = 62;
        else if (c == '/')
            v = 63;
        else if (c == '=')
            v = -1;
        else
            return 0;                  /* invalid atom */
        vals[i] = v;
    }

    if (vals[0] == -1 || vals[1] == -1)
        return 0;
    if (vals[2] == -1 && vals[3] != -1)
        return 0;

    if (vals[3] != -1)
        len = 3;
    else if (vals[2] != -1)
        len = 2;
    else
        len = 1;

    word = ((vals[0] << 18) |
            (vals[1] << 12) | ((vals[2] & 0x3F) << 6) | (vals[3] & 0x3F));
    out[0] = (word >> 16) & 0xFF;
    if (len > 1)
        out[1] = (word >> 8) & 0xFF;
    if (len > 2)
        out[2] = word & 0xFF;
    return len;
}